

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeBidirectionalLSTMLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  BiDirectionalLSTMLayerParams *this_00;
  uint64 val;
  uint64 val_00;
  LSTMParams *this_01;
  ShapeRange *other;
  mapped_type *this_02;
  mapped_type *this_03;
  mapped_type *this_04;
  mapped_type *this_05;
  mapped_type *this_06;
  mapped_type *this_07;
  ShapeConstraint *hiddenOutShapeRev;
  ShapeConstraint *hiddenInShapeRev;
  ShapeConstraint *stateOutShapeRev;
  ShapeConstraint *stateInShapeRev;
  ShapeConstraint *hiddenOutShape;
  ShapeConstraint *hiddenInShape;
  ShapeConstraint *stateOutShape;
  ShapeConstraint *stateInShape;
  size_t outSize;
  size_t inSize;
  BiDirectionalLSTMLayerParams *recurrent;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(pmVar5,psVar3);
  this_00 = Specification::NeuralNetworkLayer::bidirectionallstm(specLayer);
  val = Specification::BiDirectionalLSTMLayerParams::inputvectorsize(this_00);
  val_00 = Specification::BiDirectionalLSTMLayerParams::outputvectorsize(this_00);
  ShapeConstraint::upperBoundSequence(pmVar4,10000);
  ShapeConstraint::setChannel(pmVar4,val);
  ShapeConstraint::setHeight(pmVar4,1);
  ShapeConstraint::setWidth(pmVar4,1);
  ShapeConstraint::setChannel(pmVar5,val_00 << 1);
  ShapeConstraint::setHeight(pmVar5,1);
  ShapeConstraint::setWidth(pmVar5,1);
  this_01 = Specification::BiDirectionalLSTMLayerParams::params(this_00);
  bVar1 = Specification::LSTMParams::sequenceoutput(this_01);
  if (bVar1) {
    other = ShapeConstraint::sequenceRange(pmVar4);
    ShapeConstraint::updateSequenceRange(pmVar5,other);
  }
  else {
    ShapeConstraint::setSequence(pmVar5,1);
  }
  iVar2 = Specification::NeuralNetworkLayer::input_size(specLayer);
  if (4 < iVar2) {
    psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,1);
    ShapeConstraint::setName(pmVar5,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,2);
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,2);
    this_03 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,2);
    ShapeConstraint::setName(this_03,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,3);
    this_04 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,3);
    this_05 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,3);
    ShapeConstraint::setName(this_05,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,4);
    this_06 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,4);
    this_07 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,4);
    ShapeConstraint::setName(this_07,psVar3);
    ShapeConstraint::setSequence(pmVar4,1);
    ShapeConstraint::setChannel(pmVar4,val_00);
    ShapeConstraint::setHeight(pmVar4,1);
    ShapeConstraint::setWidth(pmVar4,1);
    ShapeConstraint::setSequence(this_02,1);
    ShapeConstraint::setChannel(this_02,val_00);
    ShapeConstraint::setHeight(this_02,1);
    ShapeConstraint::setWidth(this_02,1);
    ShapeConstraint::setSequence(pmVar5,1);
    ShapeConstraint::setChannel(pmVar5,val_00);
    ShapeConstraint::setHeight(pmVar5,1);
    ShapeConstraint::setWidth(pmVar5,1);
    ShapeConstraint::setSequence(this_03,1);
    ShapeConstraint::setChannel(this_03,val_00);
    ShapeConstraint::setHeight(this_03,1);
    ShapeConstraint::setWidth(this_03,1);
    ShapeConstraint::setSequence(this_04,1);
    ShapeConstraint::setChannel(this_04,val_00);
    ShapeConstraint::setHeight(this_04,1);
    ShapeConstraint::setWidth(this_04,1);
    ShapeConstraint::setSequence(this_06,1);
    ShapeConstraint::setChannel(this_06,val_00);
    ShapeConstraint::setHeight(this_06,1);
    ShapeConstraint::setWidth(this_06,1);
    ShapeConstraint::setSequence(this_05,1);
    ShapeConstraint::setChannel(this_05,val_00);
    ShapeConstraint::setHeight(this_05,1);
    ShapeConstraint::setWidth(this_05,1);
    ShapeConstraint::setSequence(this_07,1);
    ShapeConstraint::setChannel(this_07,val_00);
    ShapeConstraint::setHeight(this_07,1);
    ShapeConstraint::setWidth(this_07,1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBidirectionalLSTMLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::BiDirectionalLSTMLayerParams& recurrent = specLayer.bidirectionallstm();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    // This is the current maximum sequence length for bidirectional models.
    inputShape.upperBoundSequence(10000);
    
    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(2*outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);
    if (recurrent.params().sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    if (specLayer.input_size() < 5) {
        return;
    }

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

    ShapeConstraint& hiddenInShape = blobShapes[specLayer.input(2)];
    ShapeConstraint& hiddenOutShape = blobShapes[specLayer.output(2)];
    hiddenOutShape.setName(specLayer.output(2));

    ShapeConstraint& stateInShapeRev = blobShapes[specLayer.input(3)];
    ShapeConstraint& stateOutShapeRev = blobShapes[specLayer.output(3)];
    stateOutShapeRev.setName(specLayer.output(3));

    ShapeConstraint& hiddenInShapeRev = blobShapes[specLayer.input(4)];
    ShapeConstraint& hiddenOutShapeRev = blobShapes[specLayer.output(4)];
    hiddenOutShapeRev.setName(specLayer.output(4));


    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    hiddenInShape.setSequence(1);
    hiddenInShape.setChannel(outSize);
    hiddenInShape.setHeight(1);
    hiddenInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

    hiddenOutShape.setSequence(1);
    hiddenOutShape.setChannel(outSize);
    hiddenOutShape.setHeight(1);
    hiddenOutShape.setWidth(1);

    stateInShapeRev.setSequence(1);
    stateInShapeRev.setChannel(outSize);
    stateInShapeRev.setHeight(1);
    stateInShapeRev.setWidth(1);

    hiddenInShapeRev.setSequence(1);
    hiddenInShapeRev.setChannel(outSize);
    hiddenInShapeRev.setHeight(1);
    hiddenInShapeRev.setWidth(1);

    stateOutShapeRev.setSequence(1);
    stateOutShapeRev.setChannel(outSize);
    stateOutShapeRev.setHeight(1);
    stateOutShapeRev.setWidth(1);

    hiddenOutShapeRev.setSequence(1);
    hiddenOutShapeRev.setChannel(outSize);
    hiddenOutShapeRev.setHeight(1);
    hiddenOutShapeRev.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}